

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O0

bool __thiscall
ON_BinaryArchive::BeginReadDictionary
          (ON_BinaryArchive *this,ON_UUID *dictionary_id,uint *version,ON_wString *dictionary_name)

{
  bool bVar1;
  undefined1 local_44 [8];
  ON_UUID id;
  int iStack_2c;
  bool rc;
  int minor_version;
  int major_version;
  ON_wString *dictionary_name_local;
  uint *version_local;
  ON_UUID *dictionary_id_local;
  ON_BinaryArchive *this_local;
  
  iStack_2c = 0;
  id.Data4[4] = '\0';
  id.Data4[5] = '\0';
  id.Data4[6] = '\0';
  id.Data4[7] = '\0';
  _minor_version = dictionary_name;
  dictionary_name_local = (ON_wString *)version;
  version_local = &dictionary_id->Data1;
  dictionary_id_local = (ON_UUID *)this;
  id.Data4[3] = BeginRead3dmChunk(this,0x40008010,&stack0xffffffffffffffd4,(int *)(id.Data4 + 4));
  if ((bool)id.Data4[3]) {
    id.Data4[3] = iStack_2c == 1;
    if (((bool)id.Data4[3]) &&
       (id.Data4[3] = BeginRead3dmChunk(this,0x40008011,&stack0xffffffffffffffd4,
                                        (int *)(id.Data4 + 4)), (bool)id.Data4[3])) {
      id.Data4[3] = iStack_2c == 1;
      if (((bool)id.Data4[3]) &&
         (id.Data4[3] = ReadUuid(this,(ON_UUID *)local_44), (bool)id.Data4[3])) {
        if (version_local != (uint *)0x0) {
          *(undefined1 (*) [8])version_local = local_44;
          *(undefined8 *)(version_local + 2) = id._0_8_;
        }
        id.Data4[3] = ReadInt(this,(ON__UINT32 *)dictionary_name_local);
        if ((bool)id.Data4[3]) {
          id.Data4[3] = ReadString(this,_minor_version);
        }
      }
      bVar1 = EndRead3dmChunk(this);
      if (!bVar1) {
        id.Data4[3] = '\0';
      }
    }
    if ((id.Data4[3] & 1) == 0) {
      EndRead3dmChunk(this);
    }
  }
  return (bool)(id.Data4[3] & 1);
}

Assistant:

bool ON_BinaryArchive::BeginReadDictionary(
        ON_UUID* dictionary_id,
        unsigned int* version,
        ON_wString& dictionary_name
        )
{
  int major_version = 0;
  int minor_version = 0;
  bool rc = BeginRead3dmChunk(TCODE_DICTIONARY,&major_version,&minor_version);
  if ( rc )
  {
    for(;;)
    {
      rc = (1 == major_version);
      if (!rc) break;

      // Read dictionary id chunk
      rc = BeginRead3dmChunk(TCODE_DICTIONARY_ID,&major_version,&minor_version);
      if ( !rc ) break;
      for(;;)
      {
        rc = (1==major_version);
        if (!rc) break;
        ON_UUID id;
        rc = ReadUuid(id);
        if (!rc) break;
        if ( dictionary_id )
          *dictionary_id = id;
        rc = ReadInt(version);
        if (!rc) break;
        rc = ReadString(dictionary_name);
        if (!rc) break;
        break;
      }
      if ( !EndRead3dmChunk() ) // TCODE_DICTIONARY_ID end
        rc = false;
      break;
    }

    if ( !rc )
      EndRead3dmChunk(); // TCODE_DICTIONARY end
  }
  return rc;
}